

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O3

bool __thiscall slang::parsing::Preprocessor::peekSameLine(Preprocessor *this)

{
  bool bVar1;
  
  if ((this->currentToken).info != (Info *)0x0) {
    bVar1 = Token::isOnSameLine(&this->currentToken);
    return bVar1;
  }
  if (this->currentMacroToken != (Token *)0x0) {
    bVar1 = Token::isOnSameLine(this->currentMacroToken);
    return bVar1;
  }
  bVar1 = Lexer::isNextTokenOnSameLine
                    ((Lexer *)(this->lexerStack).
                              super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                              .data_[(this->lexerStack).
                                     super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                     .len - 1]._M_t.
                              super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
                              .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>);
  return bVar1;
}

Assistant:

bool valid() const { return info != nullptr; }